

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# builder.cpp
# Opt level: O0

BaseNode * __thiscall asmjit::v1_14::BaseBuilder::addNode(BaseBuilder *this,BaseNode *node)

{
  long lVar1;
  undefined8 *puVar2;
  bool bVar3;
  BaseNode *in_RSI;
  long in_RDI;
  BaseNode *next;
  BaseNode *prev;
  char *in_stack_00000350;
  int in_stack_0000035c;
  char *in_stack_00000360;
  
  if (*(long *)in_RSI != 0) {
    DebugUtils::assertionFailed(in_stack_00000360,in_stack_0000035c,in_stack_00000350);
  }
  if (*(long *)(in_RSI + 8) == 0) {
    bVar3 = Support::test<asmjit::v1_14::NodeFlags,asmjit::v1_14::NodeFlags>
                      ((NodeFlags)in_RSI[0x11],kIsActive);
    if (((bVar3 ^ 0xffU) & 1) != 0) {
      if (*(long *)(in_RDI + 0x198) == 0) {
        if (*(long *)(in_RDI + 0x1a0) == 0) {
          *(BaseNode **)(in_RDI + 0x1a0) = in_RSI;
          *(BaseNode **)(in_RDI + 0x1a8) = in_RSI;
        }
        else {
          *(long *)(in_RSI + 8) = *(long *)(in_RDI + 0x1a0);
          **(undefined8 **)(in_RDI + 0x1a0) = in_RSI;
          *(BaseNode **)(in_RDI + 0x1a0) = in_RSI;
        }
      }
      else {
        lVar1 = *(long *)(in_RDI + 0x198);
        puVar2 = *(undefined8 **)(*(long *)(in_RDI + 0x198) + 8);
        *(long *)in_RSI = lVar1;
        *(undefined8 **)(in_RSI + 8) = puVar2;
        *(BaseNode **)(lVar1 + 8) = in_RSI;
        if (puVar2 == (undefined8 *)0x0) {
          *(BaseNode **)(in_RDI + 0x1a8) = in_RSI;
        }
        else {
          *puVar2 = in_RSI;
        }
      }
      in_RSI[0x11] = (BaseNode)((byte)in_RSI[0x11] | 0x80);
      if (in_RSI[0x10] == (BaseNode)0x2) {
        *(undefined1 *)(in_RDI + 0x1b1) = 1;
      }
      *(BaseNode **)(in_RDI + 0x198) = in_RSI;
      return in_RSI;
    }
    DebugUtils::assertionFailed(in_stack_00000360,in_stack_0000035c,in_stack_00000350);
  }
  DebugUtils::assertionFailed(in_stack_00000360,in_stack_0000035c,in_stack_00000350);
}

Assistant:

BaseNode* BaseBuilder::addNode(BaseNode* node) noexcept {
  ASMJIT_ASSERT(!node->_prev);
  ASMJIT_ASSERT(!node->_next);
  ASMJIT_ASSERT(!node->isActive());

  if (!_cursor) {
    if (_nodeList.empty()) {
      _nodeList.reset(node, node);
    }
    else {
      node->_next = _nodeList.first();
      _nodeList._first->_prev = node;
      _nodeList._first = node;
    }
  }
  else {
    BaseNode* prev = _cursor;
    BaseNode* next = _cursor->next();

    node->_prev = prev;
    node->_next = next;

    prev->_next = node;
    if (next)
      next->_prev = node;
    else
      _nodeList._last = node;
  }

  node->addFlags(NodeFlags::kIsActive);
  if (node->isSection())
    _dirtySectionLinks = true;

  _cursor = node;
  return node;
}